

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTestFile.cpp
# Opt level: O1

bool Imf_2_5::isOpenExrFile(IStream *is,bool *tiled,bool *deep,bool *multiPart)

{
  int iVar1;
  undefined4 extraout_var;
  char b [4];
  char b_1 [4];
  int local_40;
  undefined1 local_3c;
  byte local_3b;
  bool *local_38;
  
  local_38 = tiled;
  iVar1 = (*is->_vptr_IStream[5])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    (*is->_vptr_IStream[6])(is,0);
  }
  (*is->_vptr_IStream[3])(is,&local_40,4);
  (*is->_vptr_IStream[3])(is,&local_3c,4);
  (*is->_vptr_IStream[6])(is,CONCAT44(extraout_var,iVar1));
  *local_38 = (bool)(local_3b >> 1 & 1);
  *deep = (bool)(local_3b >> 3 & 1);
  *multiPart = (bool)(local_3b >> 4 & 1);
  return local_40 == 0x1312f76;
}

Assistant:

bool
isOpenExrFile
    (IStream &is,
     bool &tiled,
     bool &deep,
     bool &multiPart)
{
    try
    {
	Int64 pos = is.tellg();

	if (pos != 0)
	    is.seekg (0);

	int magic, version;
	Xdr::read <StreamIO> (is, magic);
	Xdr::read <StreamIO> (is, version);

	is.seekg (pos);

	tiled = isTiled (version);
	deep = isNonImage (version);
	multiPart = isMultiPart (version);
	return magic == MAGIC;
    }
    catch (...)
    {
	is.clear();
	tiled = false;
	return false;
    }
}